

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNDefiningobj::gen_code(CTPNDefiningobj *this,int discard,int param_3)

{
  int iVar1;
  size_t in_RCX;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  int in_ESI;
  uchar in_stack_000000df;
  CTcGenTarg *in_stack_000000e0;
  
  iVar1 = CTcCodeStream::is_self_available(G_cs);
  if (iVar1 == 0) {
    CTcTokenizer::log_error(0x2d20);
  }
  if (in_ESI == 0) {
    CTcGenTarg::write_op(in_stack_000000e0,in_stack_000000df);
    CTcDataStream::write
              (&G_cs->super_CTcDataStream,3,(void *)CONCAT44(extraout_var,extraout_EDX),in_RCX);
    CTcGenTarg::note_push((CTcGenTarg *)0x2cffef);
  }
  return;
}

Assistant:

void CTPNDefiningobj::gen_code(int discard, int)
{
    /* it's an error if we're not in a method context */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_DEFININGOBJ_NOT_AVAIL);

    /* if we're not discarding the result, push the defining object ID */
    if (!discard)
    {
        G_cg->write_op(OPC_PUSHCTXELE);
        G_cs->write(PUSHCTXELE_DEFOBJ);
        G_cg->note_push();
    }
}